

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O0

void do_cmd_pickup(command_conflict *cmd)

{
  byte bVar1;
  object *local_20;
  object *obj;
  command_conflict *pcStack_10;
  wchar_t energy_cost;
  command_conflict *cmd_local;
  
  obj._4_4_ = 0;
  local_20 = (object *)0x0;
  pcStack_10 = cmd;
  cmd_get_arg_item((command *)cmd,"item",&local_20);
  bVar1 = player_pickup_item(player,local_20,false);
  obj._4_4_ = ((uint)bVar1 * (uint)z_info->move_energy) / 10 + obj._4_4_;
  if ((int)(uint)z_info->move_energy < obj._4_4_) {
    obj._4_4_ = (wchar_t)z_info->move_energy;
  }
  player->upkeep->energy_use = obj._4_4_;
  player->upkeep->redraw = player->upkeep->redraw | 0x800000;
  return;
}

Assistant:

void do_cmd_pickup(struct command *cmd)
{
	int energy_cost = 0;
	struct object *obj = NULL;

	/* See if we have an item already */
	(void) cmd_get_arg_item(cmd, "item", &obj);

	/* Pick up floor objects with a menu for multiple objects */
	energy_cost += player_pickup_item(player, obj, false)
		* z_info->move_energy / 10;

	/* Limit */
	if (energy_cost > z_info->move_energy) energy_cost = z_info->move_energy;

	/* Charge this amount of energy. */
	player->upkeep->energy_use = energy_cost;

	/* Redraw the object list using the upkeep flag so that the update can be
	 * somewhat coalesced. Use event_signal(EVENT_ITEMLIST to force update. */
	player->upkeep->redraw |= (PR_ITEMLIST);
}